

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,StandardPropertyCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  SyntaxNode *local_60;
  size_t index_local;
  StandardPropertyCaseItemSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (StandardPropertyCaseItemSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->expressions).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    token.kind = (this->colon).kind;
    token._2_1_ = (this->colon).field_0x2;
    token.numFlags.raw = (this->colon).numFlags.raw;
    token.rawLen = (this->colon).rawLen;
    token.info = (this->colon).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    node = &not_null<slang::syntax::PropertyExprSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax StandardPropertyCaseItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &expressions;
        case 1: return colon;
        case 2: return expr.get();
        case 3: return semi;
        default: return nullptr;
    }
}